

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O1

bool operator==(SettingsValue *a,SettingsValue *b)

{
  int iVar1;
  long in_FS_OFFSET;
  bool bVar2;
  size_type *local_50;
  _Alloc_hider local_48;
  size_type local_40 [2];
  undefined8 local_30;
  _Alloc_hider local_28;
  pointer local_20;
  undefined8 local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::write_abi_cxx11_((UniValue *)&stack0xffffffffffffffd0,(int)a,(void *)0x0,0);
  UniValue::write_abi_cxx11_((UniValue *)&local_50,(int)b,(void *)0x0,0);
  if (local_28._M_p == local_48._M_p) {
    if (local_28._M_p == (pointer)0x0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((void *)local_30,local_50,(size_t)local_28._M_p);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((pointer *)local_30 != &stack0xffffffffffffffe0) {
    operator_delete((void *)local_30,(ulong)((long)&(local_20->_M_dataplus)._M_p + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline bool operator==(const common::SettingsValue& a, const common::SettingsValue& b)
{
    return a.write() == b.write();
}